

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_integer_points_kd_tree_decoder.h
# Opt level: O1

void __thiscall
draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodeNumber
          (DynamicIntegerPointsKdTreeDecoder<4> *this,int nbits,uint32_t *value)

{
  bool bVar1;
  ulong uVar2;
  RAnsBitDecoder *this_00;
  uint32_t uVar3;
  
  if (nbits < 1) {
    uVar3 = 0;
  }
  else {
    this_00 = (RAnsBitDecoder *)&this->numbers_decoder_;
    uVar2 = (ulong)(uint)nbits;
    uVar3 = 0;
    do {
      bVar1 = RAnsBitDecoder::DecodeNextBit(this_00);
      uVar3 = (uint)bVar1 + uVar3 * 2;
      this_00 = this_00 + 1;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  *value = uVar3;
  return;
}

Assistant:

void DecodeNumber(int nbits, uint32_t *value) {
    numbers_decoder_.DecodeLeastSignificantBits32(nbits, value);
  }